

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O0

Gia_Man_t * Gia_ManDupCofactorVar(Gia_Man_t *p,int iVar,int Value)

{
  int iVar1;
  uint uVar2;
  Gia_Man_t *p_00;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  bool bVar6;
  int local_34;
  Gia_Obj_t *pGStack_30;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int Value_local;
  int iVar_local;
  Gia_Man_t *p_local;
  
  if (-1 < iVar) {
    iVar1 = Gia_ManPiNum(p);
    if (iVar < iVar1) {
      if ((Value != 0) && (Value != 1)) {
        __assert_fail("Value == 0 || Value == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                      ,0x64c,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
      }
      iVar1 = Gia_ManObjNum(p);
      p_00 = Gia_ManStart(iVar1);
      pcVar3 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar3;
      pcVar3 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar3;
      Gia_ManFillValue(p);
      pGVar4 = Gia_ManConst0(p);
      pGVar4->Value = 0;
      local_34 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCis);
        bVar6 = false;
        if (local_34 < iVar1) {
          pGStack_30 = Gia_ManCi(p,local_34);
          bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        uVar2 = Gia_ManAppendCi(p_00);
        pGStack_30->Value = uVar2;
        local_34 = local_34 + 1;
      }
      pGVar4 = Gia_ManPi(p,iVar);
      pGVar4->Value = Value;
      Gia_ManHashAlloc(p_00);
      local_34 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar6 = false;
        if (local_34 < iVar1) {
          pGStack_30 = Gia_ManCo(p,local_34);
          bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        pGVar4 = Gia_ObjFanin0(pGStack_30);
        Gia_ManDupCofactorVar_rec(p_00,p,pGVar4);
        local_34 = local_34 + 1;
      }
      local_34 = 0;
      while( true ) {
        iVar1 = Vec_IntSize(p->vCos);
        bVar6 = false;
        if (local_34 < iVar1) {
          pGStack_30 = Gia_ManCo(p,local_34);
          bVar6 = pGStack_30 != (Gia_Obj_t *)0x0;
        }
        if (!bVar6) break;
        iVar1 = Gia_ObjFanin0Copy(pGStack_30);
        Gia_ManAppendCo(p_00,iVar1);
        local_34 = local_34 + 1;
      }
      iVar1 = Gia_ManRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      p_00->nConstrs = p->nConstrs;
      pGVar5 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar5;
    }
  }
  __assert_fail("iVar >= 0 && iVar < Gia_ManPiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0x64b,"Gia_Man_t *Gia_ManDupCofactorVar(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    assert( iVar >= 0 && iVar < Gia_ManPiNum(p) );
    assert( Value == 0 || Value == 1 );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManPi( p, iVar )->Value = Value; // modification!
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupCofactorVar_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = p->nConstrs;
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}